

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O1

void __thiscall
pbrt::syntactic::BasicLexer<pbrt::syntactic::MappedFile>::CharBuffer::operator<<
          (CharBuffer *this,char c)

{
  pointer *ppcVar1;
  iterator __position;
  char local_1;
  
  __position._M_current =
       (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (__position._M_current ==
      (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
              ((vector<char,std::allocator<char>> *)this,__position,&local_1);
  }
  else {
    *__position._M_current = c;
    ppcVar1 = &(this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return;
}

Assistant:

void operator<<(char c) { data_.push_back(c); }